

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrammaticalAnalyzer.cpp
# Opt level: O2

void __thiscall
LLGrammaticalAnalyzer::AnalyzeToken
          (LLGrammaticalAnalyzer *this,vector<quadraple,_std::allocator<quadraple>_> *token)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>_>_>
  *this_00;
  pointer pqVar1;
  pointer ppVar2;
  pointer pbVar3;
  bool bVar4;
  __type_conflict _Var5;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *this_01;
  iterator iVar6;
  mapped_type *pmVar7;
  mapped_type_conflict1 *pmVar8;
  long lVar9;
  ostream *poVar10;
  int iVar11;
  _Elt_pointer pbVar12;
  pointer pbVar13;
  ulong uVar14;
  int local_13c;
  string stritem;
  quadraple item;
  string tp;
  stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  S;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> tt;
  
  std::
  stack<std::__cxx11::string,std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
  ::stack<std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>,void>(&S);
  std::__cxx11::string::string((string *)&item,"program",(allocator *)&tp);
  std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((deque<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&S,&item.tokentype)
  ;
  std::__cxx11::string::~string((string *)&item);
  this_00 = &this->TABLE;
  local_13c = 0;
  do {
    pqVar1 = (token->super__Vector_base<quadraple,_std::allocator<quadraple>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)(((long)(token->super__Vector_base<quadraple,_std::allocator<quadraple>_>)._M_impl.
                       super__Vector_impl_data._M_finish - (long)pqVar1) / 0x48) <=
        (ulong)(long)local_13c) break;
    quadraple::quadraple(&item,pqVar1 + local_13c);
    if (S.c.
        super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
        S.c.
        super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Deque_impl_data._M_start._M_cur) {
      poVar10 = std::operator<<((ostream *)&std::cout,"Error");
      std::endl<char,std::char_traits<char>>(poVar10);
      quadraple::~quadraple(&item);
      break;
    }
    pbVar12 = S.c.
              super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (S.c.
        super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
        S.c.
        super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      pbVar12 = S.c.
                super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x10;
    }
    std::__cxx11::string::string((string *)&tp,(string *)(pbVar12 + -1));
    std::
    deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::pop_back(&S.c);
    stritem._M_dataplus._M_p = (pointer)&stritem.field_2;
    stritem._M_string_length = 0;
    stritem.field_2._M_local_buf[0] = '\0';
    bVar4 = std::operator==(&item.tokentype,"real");
    if (((bVar4) || (bVar4 = std::operator==(&item.tokentype,"int"), bVar4)) ||
       (bVar4 = std::operator==(&item.tokentype,"identifier"), bVar4)) {
      std::__cxx11::string::assign((char *)&stritem);
    }
    else {
      std::__cxx11::string::_M_assign((string *)&stritem);
    }
    _Var5 = std::operator==(&stritem,&tp);
    if (_Var5) {
      local_13c = local_13c + 1;
      iVar11 = 3;
    }
    else {
      this_01 = &std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>_>_>
                 ::operator[](this_00,&tp)->_M_t;
      iVar6 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
              ::find(this_01,&stritem);
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>_>_>
               ::operator[](this_00,&tp);
      if ((_Rb_tree_header *)iVar6._M_node == &(pmVar7->_M_t)._M_impl.super__Rb_tree_header) {
        poVar10 = std::operator<<((ostream *)&std::cout,"error");
        poVar10 = std::operator<<(poVar10," ");
        poVar10 = (ostream *)std::ostream::operator<<(poVar10,item.linenumber);
        poVar10 = std::operator<<(poVar10," ");
        poVar10 = (ostream *)std::ostream::operator<<(poVar10,item.lineposition);
        std::endl<char,std::char_traits<char>>(poVar10);
        iVar11 = 2;
      }
      else {
        pmVar7 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>_>_>
                 ::operator[](this_00,&tp);
        pmVar8 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                 ::operator[](pmVar7,&stritem);
        lVar9 = (long)*pmVar8;
        if (lVar9 == -1) {
          poVar10 = std::operator<<((ostream *)&std::cout,"error");
          poVar10 = std::operator<<(poVar10," ");
          poVar10 = (ostream *)std::ostream::operator<<(poVar10,item.linenumber);
          poVar10 = std::operator<<(poVar10," ");
          poVar10 = (ostream *)std::ostream::operator<<(poVar10,item.lineposition);
          std::endl<char,std::char_traits<char>>(poVar10);
          iVar11 = 2;
        }
        else {
          poVar10 = std::operator<<((ostream *)&std::cout,
                                    (string *)
                                    ((this->VectorP).
                                     super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start + lVar9));
          std::operator<<(poVar10,"->");
          ppVar2 = (this->VectorP).
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pbVar3 = *(pointer *)
                    ((long)&ppVar2[lVar9].second.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl + 8);
          for (pbVar13 = *(pointer *)
                          &ppVar2[lVar9].second.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl; pbVar13 != pbVar3; pbVar13 = pbVar13 + 1) {
            std::__cxx11::string::string((string *)&tt,(string *)pbVar13);
            poVar10 = std::operator<<((ostream *)&std::cout,(string *)&tt);
            std::operator<<(poVar10,' ');
            std::__cxx11::string::~string((string *)&tt);
          }
          std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
          ppVar2 = (this->VectorP).
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          uVar14 = (ulong)((long)*(pointer *)
                                  ((long)&ppVar2[lVar9].second.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl + 8) -
                          *(long *)&ppVar2[lVar9].second.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl) >> 5 & 0xffffffff;
          while( true ) {
            uVar14 = uVar14 - 1;
            if ((int)(uint)uVar14 < 0) break;
            std::__cxx11::string::string
                      ((string *)&tt,
                       (string *)
                       ((ulong)((uint)uVar14 & 0x7fffffff) * 0x20 +
                       *(long *)&(this->VectorP).
                                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[lVar9].second.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl));
            bVar4 = std::operator!=(&tt,"#");
            if (bVar4) {
              std::
              deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back(&S.c,&tt);
            }
            std::__cxx11::string::~string((string *)&tt);
          }
          iVar11 = 0;
        }
      }
    }
    std::__cxx11::string::~string((string *)&stritem);
    std::__cxx11::string::~string((string *)&tp);
    quadraple::~quadraple(&item);
  } while ((iVar11 == 0) || (iVar11 == 3));
  if (S.c.
      super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
      S.c.
      super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Deque_impl_data._M_start._M_cur) {
    poVar10 = std::operator<<((ostream *)&std::cout,"No Grammatical Error.");
    std::endl<char,std::char_traits<char>>(poVar10);
  }
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~deque(&S.c);
  return;
}

Assistant:

void LLGrammaticalAnalyzer::AnalyzeToken(std::vector<quadraple> &token) {
    std::stack<std::string> S;
    S.push("program");
    for (int i = 0; i < token.size();) {
        quadraple item = token[i];
        if (S.empty()) {
            std::cout << "Error" << std::endl;
            break;
        }
        std::string tp = S.top();
        S.pop();
        std::string stritem;
        if (item.tokentype == "real") stritem = "REALNUM";
        else if (item.tokentype == "int") stritem = "INTNUM";
        else if (item.tokentype == "identifier") stritem = "ID";
        else stritem = token[i].attributevalue;
        if (stritem == tp) {
            ++i;
            continue;
        } else {
            if (TABLE[tp].find(stritem) == TABLE[tp].end()) {
                std::cout << "error" << " " << item.linenumber << " " << item.lineposition << std::endl;
                break;
            }
            int pr = TABLE[tp][stritem];
            if (pr == -1) {
                std::cout << "error" << " " << item.linenumber << " " << item.lineposition << std::endl;
                break;
            } else {
                //std::cout << pr <<std::endl;
                std::cout << VectorP[pr].first << "->";
                for (auto tt : VectorP[pr].second) {
                    std::cout << tt << ' ';
                }
                std::cout << std::endl;
                for (int j = VectorP[pr].second.size() - 1; j >= 0; j--) {
                    std::string r = VectorP[pr].second[j];
                    if (r != "#") {
                        S.push(r);
                    }
                }
            }
        }
    }
    if (S.empty()) {
        std::cout << "No Grammatical Error." << std::endl;
    }
}